

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_part_file.cpp
# Opt level: O0

slot_index_t __thiscall
libtorrent::aux::posix_part_file::allocate_slot(posix_part_file *this,piece_index_t piece)

{
  bool bVar1;
  reference pvVar2;
  mapped_type *pmVar3;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
  local_28;
  const_iterator local_20;
  posix_part_file *local_18;
  posix_part_file *this_local;
  piece_index_t piece_local;
  slot_index_t slot;
  
  this_local._4_4_ = 0xffffffff;
  local_18 = this;
  this_local._0_4_ = piece.m_val;
  bVar1 = ::std::
          vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
          ::empty(&this->m_free_slots);
  if (bVar1) {
    this_local._4_4_ = (this->m_num_allocated).m_val;
    strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>::operator++(&this->m_num_allocated)
    ;
  }
  else {
    pvVar2 = ::std::
             vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
             ::front(&this->m_free_slots);
    this_local._4_4_ = pvVar2->m_val;
    local_28._M_current =
         (strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void> *)
         ::std::
         vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
         ::begin(&this->m_free_slots);
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>>>>
    ::
    __normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>*>
              ((__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>>>>
                *)&local_20,&local_28);
    ::std::
    vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
    ::erase(&this->m_free_slots,local_20);
  }
  pmVar3 = ::std::
           unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
           ::operator[](&this->m_piece_map,(key_type *)&this_local);
  pmVar3->m_val = this_local._4_4_;
  this->m_dirty_metadata = true;
  return (slot_index_t)this_local._4_4_;
}

Assistant:

slot_index_t posix_part_file::allocate_slot(piece_index_t const piece)
	{
		TORRENT_ASSERT(m_piece_map.find(piece) == m_piece_map.end());
		slot_index_t slot(-1);
		if (!m_free_slots.empty())
		{
			slot = m_free_slots.front();
			m_free_slots.erase(m_free_slots.begin());
		}
		else
		{
			slot = m_num_allocated;
			++m_num_allocated;
		}

		m_piece_map[piece] = slot;
		m_dirty_metadata = true;
		return slot;
	}